

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Vector.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)'\x03'>_>::Decode
          (LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *this,
          KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (2 < KVar1) {
    (*(this->m_X).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_X,stream);
    (*(this->m_Y).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Y,stream);
    (*(this->m_Z).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Z,stream);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void LE_Vector<Type>::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < LE_VECTOR_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> KDIS_STREAM m_X
           >> KDIS_STREAM m_Y
           >> KDIS_STREAM m_Z;
}